

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctstr_iendswith(char *str,char *check)

{
  size_t sVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  if (str != (char *)0x0 || check != (char *)0x0) {
    if ((str == (char *)0x0) != (check == (char *)0x0)) {
      return 0;
    }
    sVar1 = strlen(check);
    sVar2 = strlen(str);
    if (sVar2 < sVar1) {
      return 0;
    }
    if (sVar1 != 0) {
      pp_Var3 = __ctype_tolower_loc();
      lVar4 = 0;
      do {
        if ((*pp_Var3)[str[lVar4 + sVar2]] != (*pp_Var3)[check[lVar4 + sVar1]]) {
          return 0;
        }
        lVar4 = lVar4 + -1;
      } while (-lVar4 != sVar1);
    }
  }
  return 1;
}

Assistant:

static int
fctstr_iendswith(char const *str, char const *check)
{
    size_t check_i;
    size_t str_i;
    if ( str == NULL && check == NULL )
    {
        return 1;
    }
    else if ( ((str == NULL) && (check != NULL))
              || ((str != NULL) && (check == NULL)) )
    {
        return 0;
    }
    check_i = strlen(check);
    str_i = strlen(str);
    if ( str_i < check_i )
    {
        return 0;   /* Can't do it string is too small. */
    }
    for ( ; check_i != 0; --check_i, --str_i)
    {
        if ( tolower(str[str_i]) != tolower(check[check_i]) )
        {
            return 0; /* Found a case where they are not equal. */
        }
    }
    /* Exhausted check against string, can only be true. */
    return 1;
}